

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<false,slang::ast::ASTContext>
          (ASTContext *__return_storage_ptr__,DeclaredType *this)

{
  uint uVar1;
  InstanceBodySymbol *pIVar2;
  Scope *pSVar3;
  uint uVar4;
  ulong uVar5;
  InstanceSymbol *symbol;
  ulong uVar6;
  Scope *scope;
  LookupLocation LVar7;
  
  uVar1 = (this->flags).m_bits;
  uVar5 = (ulong)((uVar1 & 0x40) * 2);
  uVar6 = uVar5 + 0x100;
  if ((uVar1 & 0x10) != 0) {
    uVar6 = uVar5;
  }
  symbol = (InstanceSymbol *)this->parent;
  pSVar3 = (symbol->super_InstanceSymbolBase).super_Symbol.parentScope;
  if (pSVar3 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
               ,0x1c6,
               "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
              );
  }
  if ((uVar1 & 8) == 0) {
    uVar4 = *(uint *)&this->field_0x3c & 0x3fffffff;
    uVar5 = (ulong)uVar4;
    scope = pSVar3;
    if (uVar4 != 0) goto LAB_001cc395;
  }
  else {
    pIVar2 = Symbol::as<slang::ast::InstanceBodySymbol>(pSVar3->thisSym);
    symbol = pIVar2->parentInstance;
    if (symbol == (InstanceSymbol *)0x0) {
      assert::assertFailed
                ("inst",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1ce,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
    scope = (symbol->super_InstanceSymbolBase).super_Symbol.parentScope;
    if (scope == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1d1,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
  }
  LVar7 = LookupLocation::before((Symbol *)symbol);
  pSVar3 = LVar7.scope;
  uVar5 = LVar7._8_8_ & 0xffffffff;
LAB_001cc395:
  LVar7._8_8_ = uVar5;
  LVar7.scope = pSVar3;
  ASTContext::ASTContext
            (__return_storage_ptr__,scope,LVar7,
             (bitmask<slang::ast::ASTFlags>)
             (uVar6 | ((uVar1 & 0x80) << 0x16 | (uVar1 & 0x4000) << 0xd)));
  return __return_storage_ptr__;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;

    const Scope* scope = parent.getParentScope();
    ASSERT(scope);

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto inst = scope->asSymbol().as<InstanceBodySymbol>().parentInstance;
        ASSERT(inst);

        scope = inst->getParentScope();
        ASSERT(scope);

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}